

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TrustStoreInMemoryTest_OneRootTrusted_Test::TestBody
          (TrustStoreInMemoryTest_OneRootTrusted_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_180;
  Message local_178;
  string local_170;
  CertificateTrust local_150;
  string local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_110;
  Message local_108;
  string local_100;
  CertificateTrust local_e0;
  string local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  CertificateTrust trust;
  shared_ptr<const_bssl::ParsedCertificate> local_90;
  undefined1 local_80 [8];
  TrustStoreInMemory in_memory;
  TrustStoreInMemoryTest_OneRootTrusted_Test *this_local;
  
  in_memory.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  TrustStoreInMemory::TrustStoreInMemory((TrustStoreInMemory *)local_80);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            (&local_90,&(this->super_TrustStoreInMemoryTest).newroot_);
  TrustStoreInMemory::AddTrustAnchor((TrustStoreInMemory *)local_80,&local_90);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_90);
  peVar2 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->super_TrustStoreInMemoryTest).newroot_.
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     );
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )TrustStoreInMemory::GetTrust((TrustStoreInMemory *)local_80,peVar2);
  local_e0 = CertificateTrust::ForTrustAnchor();
  CertificateTrust::ToDebugString_abi_cxx11_(&local_d8,&local_e0);
  CertificateTrust::ToDebugString_abi_cxx11_(&local_100,(CertificateTrust *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b8,"CertificateTrust::ForTrustAnchor().ToDebugString()",
             "trust.ToDebugString()",&local_d8,&local_100);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  peVar2 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->super_TrustStoreInMemoryTest).oldroot_.
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     );
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )TrustStoreInMemory::GetTrust((TrustStoreInMemory *)local_80,peVar2);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar_1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  local_150 = CertificateTrust::ForUnspecified();
  CertificateTrust::ToDebugString_abi_cxx11_(&local_148,&local_150);
  CertificateTrust::ToDebugString_abi_cxx11_(&local_170,(CertificateTrust *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_128,"CertificateTrust::ForUnspecified().ToDebugString()",
             "trust.ToDebugString()",&local_148,&local_170);
  ::std::__cxx11::string::~string((string *)&local_170);
  ::std::__cxx11::string::~string((string *)&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  TrustStoreInMemory::~TrustStoreInMemory((TrustStoreInMemory *)local_80);
  return;
}

Assistant:

TEST_F(TrustStoreInMemoryTest, OneRootTrusted) {
  TrustStoreInMemory in_memory;
  in_memory.AddTrustAnchor(newroot_);

  // newroot_ is trusted.
  CertificateTrust trust = in_memory.GetTrust(newroot_.get());
  EXPECT_EQ(CertificateTrust::ForTrustAnchor().ToDebugString(),
            trust.ToDebugString());

  // oldroot_ is not.
  trust = in_memory.GetTrust(oldroot_.get());
  EXPECT_EQ(CertificateTrust::ForUnspecified().ToDebugString(),
            trust.ToDebugString());
}